

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFImporter::ImportMaterials(glTFImporter *this,Asset *r)

{
  vector<int,_std::allocator<int>_> *embeddedTexIdxs;
  uint uVar1;
  Material *pMVar2;
  ulong uVar3;
  aiMaterial **ppaVar4;
  aiMaterial *paVar5;
  uint i;
  ulong uVar6;
  aiScene *paVar7;
  size_t __n;
  aiString str;
  
  this->mScene->mNumMaterials =
       (uint)((ulong)((long)(r->materials).mObjs.
                            super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(r->materials).mObjs.
                           super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  paVar7 = this->mScene;
  ppaVar4 = (aiMaterial **)operator_new__((ulong)paVar7->mNumMaterials << 3);
  paVar7->mMaterials = ppaVar4;
  embeddedTexIdxs = &this->embeddedTexIdxs;
  uVar6 = 0;
  while( true ) {
    uVar1 = this->mScene->mNumMaterials;
    if (uVar1 <= uVar6) break;
    paVar5 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar5);
    this->mScene->mMaterials[uVar6] = paVar5;
    pMVar2 = (r->materials).mObjs.
             super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
    uVar3 = (pMVar2->super_Object).id._M_string_length;
    __n = uVar3 & 0xffffffff;
    if ((uVar3 & 0xfffffc00) != 0) {
      __n = 0x3ff;
    }
    str.length = (ai_uint32)__n;
    memcpy(str.data,(pMVar2->super_Object).id._M_dataplus._M_p,__n);
    str.data[__n] = '\0';
    aiMaterial::AddProperty(paVar5,&str,"?mat.name",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar2->ambient,paVar5,aiTextureType_AMBIENT,"$clr.ambient",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar2->diffuse,paVar5,aiTextureType_DIFFUSE,"$clr.diffuse",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar2->specular,paVar5,aiTextureType_SPECULAR,"$clr.specular",0,0)
    ;
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar2->emission,paVar5,aiTextureType_EMISSIVE,"$clr.emissive",0,0)
    ;
    aiMaterial::AddProperty<bool>(paVar5,&pMVar2->doubleSided,1,"$mat.twosided",0,0);
    if ((pMVar2->transparent == true) &&
       ((pMVar2->transparency != 1.0 || (NAN(pMVar2->transparency))))) {
      aiMaterial::AddProperty(paVar5,&pMVar2->transparency,1,"$mat.opacity",0,0);
    }
    if (0.0 < pMVar2->shininess) {
      aiMaterial::AddProperty(paVar5,&pMVar2->shininess,1,"$mat.shininess",0,0);
    }
    uVar6 = uVar6 + 1;
  }
  if (uVar1 == 0) {
    this->mScene->mNumMaterials = 1;
    paVar7 = this->mScene;
    if (paVar7->mMaterials != (aiMaterial **)0x0) {
      operator_delete__(paVar7->mMaterials);
      paVar7 = this->mScene;
    }
    ppaVar4 = (aiMaterial **)operator_new__(8);
    paVar7->mMaterials = ppaVar4;
    paVar5 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar5);
    *this->mScene->mMaterials = paVar5;
  }
  return;
}

Assistant:

void glTFImporter::ImportMaterials(glTF::Asset& r) {
    mScene->mNumMaterials = unsigned(r.materials.Size());
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];

    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        aiMaterial* aimat = mScene->mMaterials[i] = new aiMaterial();

        Material& mat = r.materials[i];

        /*if (!mat.name.empty())*/ {
            aiString str(mat.id /*mat.name*/);
            aimat->AddProperty(&str, AI_MATKEY_NAME);
        }

        SetMaterialColorProperty(embeddedTexIdxs, r, mat.ambient,  aimat, aiTextureType_AMBIENT,  AI_MATKEY_COLOR_AMBIENT );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.diffuse,  aimat, aiTextureType_DIFFUSE,  AI_MATKEY_COLOR_DIFFUSE );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.specular, aimat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.emission, aimat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);

        aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

        if (mat.transparent && (mat.transparency != 1.0f)) {
            aimat->AddProperty(&mat.transparency, 1, AI_MATKEY_OPACITY);
        }

        if (mat.shininess > 0.f) {
            aimat->AddProperty(&mat.shininess, 1, AI_MATKEY_SHININESS);
        }
    }

    if (mScene->mNumMaterials == 0) {
        mScene->mNumMaterials = 1;
        // Delete the array of length zero created above.
        delete[] mScene->mMaterials;
        mScene->mMaterials = new aiMaterial*[1];
        mScene->mMaterials[0] = new aiMaterial();
    }
}